

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CDLGRAVESTONEDOJI_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_00000298;
  double *in_stack_000002a0;
  double *in_stack_000002a8;
  double *in_stack_000002b0;
  int in_stack_000002bc;
  int in_stack_000002c0;
  int *in_stack_000002d0;
  int *in_stack_000002d8;
  int *in_stack_000002e0;
  
  TVar1 = TA_CDLGRAVESTONEDOJI
                    (in_stack_000002c0,in_stack_000002bc,in_stack_000002b0,in_stack_000002a8,
                     in_stack_000002a0,in_stack_00000298,in_stack_000002d0,in_stack_000002d8,
                     in_stack_000002e0);
  return TVar1;
}

Assistant:

TA_RetCode TA_CDLGRAVESTONEDOJI_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CDLGRAVESTONEDOJI(
/* Generated */                           startIdx,
/* Generated */                           endIdx,
/* Generated */                           params->in[0].data.inPrice.open, /* inOpen */
/* Generated */                           params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                           params->in[0].data.inPrice.low, /* inLow */
/* Generated */                           params->in[0].data.inPrice.close, /* inClose */
/* Generated */                           outBegIdx, 
/* Generated */                           outNBElement, 
/* Generated */                           params->out[0].data.outInteger /*  outInteger */ );
/* Generated */ }